

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::CmpHelperSTRNE(char *s1_expression,char *s2_expression,wchar_t *s1,wchar_t *s2)

{
  bool bVar1;
  AssertionResult *this;
  AssertionResult *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  undefined8 in_RDI;
  AssertionResult AVar3;
  wchar_t *in_stack_ffffffffffffff18;
  char (*in_stack_ffffffffffffff48) [12];
  AssertionResult *in_stack_ffffffffffffff50;
  AssertionResult *other;
  string local_88 [32];
  string local_68 [48];
  AssertionResult local_38 [3];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  bVar1 = String::WideCStringEquals(in_stack_ffffffffffffff18,(wchar_t *)0x17a4f1);
  if (bVar1) {
    other = local_38;
    AssertionFailure();
    this = AssertionResult::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    this_00 = AssertionResult::operator<<
                        (in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48);
    value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            AssertionResult::operator<<(this_00,(char (*) [7])in_stack_ffffffffffffff48);
    AssertionResult::operator<<(this_00,(char **)value);
    AssertionResult::operator<<(this_00,(char (*) [12])value);
    PrintToString<wchar_t_const*>((wchar_t **)s1);
    AssertionResult::operator<<(this_00,value);
    AssertionResult::operator<<(this_00,(char (*) [5])value);
    PrintToString<wchar_t_const*>((wchar_t **)s1);
    AssertionResult::operator<<(this_00,value);
    AssertionResult::AssertionResult(this,other);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    AssertionResult::~AssertionResult((AssertionResult *)0x17a637);
    sVar2.ptr_ = extraout_RDX;
  }
  else {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperSTRNE(const char* s1_expression,
                               const char* s2_expression,
                               const wchar_t* s1,
                               const wchar_t* s2) {
  if (!String::WideCStringEquals(s1, s2)) {
    return AssertionSuccess();
  }

  return AssertionFailure() << "Expected: (" << s1_expression << ") != ("
                            << s2_expression << "), actual: "
                            << PrintToString(s1)
                            << " vs " << PrintToString(s2);
}